

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::BuildDecompressedPathsImpl
          (CrateReader *this,BuildDecompressedPathsArg *arg)

{
  unsigned_long *puVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  size_t sVar7;
  pointer puVar8;
  pointer pPVar9;
  pointer pTVar10;
  pointer piVar11;
  uint uVar12;
  _Alloc_hider _Var13;
  ostream *poVar14;
  unsigned_long *puVar15;
  unsigned_long *puVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  int iVar20;
  unsigned_long *puVar21;
  _Elt_pointer pPVar22;
  char *pcVar23;
  unsigned_long *in_R8;
  string *elem;
  undefined8 uVar24;
  ulong uVar25;
  size_t idx;
  size_t subtreeStartIdx;
  ostringstream ss_e;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> startIndexStack;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> endIndexStack;
  Path parentPath;
  stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
  parentPathStack;
  Path rootPath;
  string local_4d0;
  string local_4b0;
  ulong local_490;
  pointer local_488;
  pointer local_480;
  size_t local_478;
  unsigned_long *local_470 [2];
  unsigned_long local_460 [2];
  unsigned_long *local_450;
  vector<int,_std::allocator<int>_> *local_448;
  undefined1 local_440 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390 [12];
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_2c8;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_278;
  Path local_228;
  _Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_158;
  Path local_100;
  
  if (arg == (BuildDecompressedPathsArg *)0x0) {
    bVar19 = false;
  }
  else {
    Path::Path(&local_228,&arg->parentPath);
    pvVar5 = arg->pathIndexes;
    if ((((pvVar5 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) ||
         (pvVar6 = arg->elementTokenIndexes, pvVar6 == (vector<int,_std::allocator<int>_> *)0x0)) ||
        (uVar24 = arg->jumps,
        (vector<int,_std::allocator<int>_> *)uVar24 == (vector<int,_std::allocator<int>_> *)0x0)) ||
       (arg->visit_table == (vector<bool,_std::allocator<bool>_> *)0x0)) {
      bVar19 = false;
    }
    else {
      local_4b0.field_2._8_8_ = arg->visit_table;
      Path::make_root_path();
      sVar7 = (this->_config).maxPathIndicesDecodeIteration;
      local_2c8._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
      local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
      local_2c8._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
      local_2c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_2c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
      local_2c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_2c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_2c8._M_impl.super__Deque_impl_data._M_map_size = 0;
      uVar25 = 0;
      ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                (&local_2c8,0);
      local_278._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
      local_278._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_278._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
      local_278._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
      local_278._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_278._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_278._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_278._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_278._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_278._M_impl.super__Deque_impl_data._M_map_size = 0;
      ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                (&local_278,0);
      local_158._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_158._M_impl.super__Deque_impl_data._M_map_size = 0;
      ::std::_Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::_M_initialize_map
                (&local_158,0);
      local_478 = sVar7;
      if (sVar7 != 0) {
        puVar16 = (unsigned_long *)arg->startIndex;
        uVar17 = arg->endIndex;
        local_480 = local_440 + 0xb0;
        local_488 = local_440 + 0x90;
        uVar25 = 0;
        local_4b0.field_2._M_allocated_capacity = uVar24;
        local_448 = pvVar6;
        do {
          pvVar6 = local_448;
          puVar15 = (unsigned_long *)(uVar17 + 1);
          local_4b0._M_string_length = (size_type)puVar16;
          local_490 = uVar25;
          if (puVar16 < puVar15) {
            do {
              local_4b0._M_string_length = (size_type)puVar16;
              if (((local_228._prim_part._M_string_length != 0) ||
                  (local_228._variant_part._M_string_length != 0)) ||
                 (local_228._prop_part._M_string_length != 0)) {
                piVar11 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                if ((unsigned_long *)
                    ((long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar11 >> 2) <= puVar16) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3)
                  ;
                  poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_440,0x11a3)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                  pcVar23 = "Index exceeds elementTokenIndexes.size()";
                  lVar18 = 0x28;
                  goto LAB_001bc1be;
                }
                uVar3 = piVar11[(long)puVar16];
                uVar12 = -uVar3;
                if (0 < (int)uVar3) {
                  uVar12 = uVar3;
                }
                pTVar10 = (this->_tokens).
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(this->_tokens).
                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 5)
                    <= (ulong)uVar12) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3)
                  ;
                  poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_440,0x11ae)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,
                             "Invalid tokenIndex in BuildDecompressedPathsImpl.",0x31);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::_M_append
                            ((char *)&this->_err,(ulong)local_4d0._M_dataplus._M_p);
                  goto LAB_001bc209;
                }
                uVar4 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[(long)puVar16];
                local_4b0._M_dataplus._M_p = (pointer)(ulong)uVar4;
                puVar16 = (unsigned_long *)
                          (((long)(this->_paths).
                                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->_paths).
                                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                          0x4ec4ec4ec4ec4ec5);
                if (puVar16 < local_4b0._M_dataplus._M_p ||
                    (long)puVar16 - (long)local_4b0._M_dataplus._M_p == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3)
                  ;
                  iVar20 = 0x11b7;
                }
                else {
                  puVar16 = (unsigned_long *)
                            (((long)(this->_elemPaths).
                                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_elemPaths).
                                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            0x4ec4ec4ec4ec4ec5);
                  if (local_4b0._M_dataplus._M_p <= puVar16 &&
                      (long)puVar16 - (long)local_4b0._M_dataplus._M_p != 0) {
                    in_R8 = (unsigned_long *)(ulong)*(uint *)(local_4b0.field_2._8_8_ + 0x18);
                    if ((local_4b0._M_dataplus._M_p <
                         in_R8 + ((long)(((_Bit_iterator *)(local_4b0.field_2._8_8_ + 0x10))->
                                        super__Bit_iterator_base)._M_p -
                                 *(long *)local_4b0.field_2._8_8_)) &&
                       ((*(ulong *)(*(long *)local_4b0.field_2._8_8_ + (ulong)(uVar4 >> 6) * 8) >>
                         ((ulong)local_4b0._M_dataplus._M_p & 0x3f) & 1) != 0)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_440,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_440,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_440,"[Crate]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_440,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_440,"():",3);
                      iVar20 = 0x11c2;
                      goto LAB_001bca49;
                    }
                    elem = &pTVar10[uVar12].str_;
                    if ((int)uVar3 < 0) {
                      Path::AppendProperty((Path *)local_440,&local_228,elem);
                    }
                    else {
                      Path::AppendElement((Path *)local_440,&local_228,elem);
                    }
                    Path::operator=((this->_paths).
                                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                                    (long)local_4b0._M_dataplus._M_p,(Path *)local_440);
                    if (local_3a0._M_p != local_480) {
                      operator_delete(local_3a0._M_p,local_390[0]._M_allocated_capacity + 1);
                    }
                    if (local_3c0._M_p != local_488) {
                      operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
                    }
                    if ((undefined1 *)local_440._96_8_ != local_440 + 0x70) {
                      operator_delete((void *)local_440._96_8_,local_3d0._M_allocated_capacity + 1);
                    }
                    if ((undefined1 *)local_440._64_8_ != local_440 + 0x50) {
                      operator_delete((void *)local_440._64_8_,local_440._80_8_ + 1);
                    }
                    local_450 = puVar15;
                    if ((undefined1 *)local_440._32_8_ != local_440 + 0x30) {
                      operator_delete((void *)local_440._32_8_,local_440._48_8_ + 1);
                    }
                    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
                      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
                    }
                    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"");
                    Path::Path((Path *)local_440,elem,&local_4d0);
                    Path::operator=((this->_elemPaths).
                                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                                    (long)local_4b0._M_dataplus._M_p,(Path *)local_440);
                    if (local_3a0._M_p != local_480) {
                      operator_delete(local_3a0._M_p,local_390[0]._M_allocated_capacity + 1);
                    }
                    uVar24 = local_4b0.field_2._M_allocated_capacity;
                    if (local_3c0._M_p != local_488) {
                      operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
                    }
                    puVar15 = local_450;
                    if ((undefined1 *)local_440._96_8_ != local_440 + 0x70) {
                      operator_delete((void *)local_440._96_8_,local_3d0._M_allocated_capacity + 1);
                    }
                    if ((undefined1 *)local_440._64_8_ != local_440 + 0x50) {
                      operator_delete((void *)local_440._64_8_,local_440._80_8_ + 1);
                    }
                    if ((undefined1 *)local_440._32_8_ != local_440 + 0x30) {
                      operator_delete((void *)local_440._32_8_,local_440._48_8_ + 1);
                    }
                    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
                      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                      operator_delete(local_4d0._M_dataplus._M_p,
                                      local_4d0.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_001bbb62;
                  }
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3)
                  ;
                  iVar20 = 0x11bc;
                }
LAB_001bc8b8:
                poVar14 = (ostream *)::std::ostream::operator<<((ostream *)local_440,iVar20);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,"Index is out-of-range",0x15);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"\n",1);
                ::std::__cxx11::stringbuf::str();
                goto LAB_001bc201;
              }
              Path::operator=(&local_228,&local_100);
              puVar8 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if ((unsigned_long *)
                  ((long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 2) <=
                  local_4b0._M_string_length) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3);
                poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_440,0x118f);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                pcVar23 = "Index exceeds pathIndexes.size()";
                lVar18 = 0x20;
                goto LAB_001bc1be;
              }
              uVar3 = puVar8[local_4b0._M_string_length];
              local_4b0._M_dataplus._M_p = (pointer)(ulong)uVar3;
              pPVar9 = (this->_paths).
                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar16 = (unsigned_long *)
                        (((long)(this->_paths).
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pPVar9 >> 4) *
                        0x4ec4ec4ec4ec4ec5);
              if (puVar16 < local_4b0._M_dataplus._M_p ||
                  (long)puVar16 - (long)local_4b0._M_dataplus._M_p == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3);
                iVar20 = 0x1195;
                goto LAB_001bc8b8;
              }
              if ((local_4b0._M_dataplus._M_p <
                   (unsigned_long *)
                   ((ulong)*(uint *)(local_4b0.field_2._8_8_ + 0x18) +
                   ((long)(((_Bit_iterator *)(local_4b0.field_2._8_8_ + 0x10))->
                          super__Bit_iterator_base)._M_p - *(long *)local_4b0.field_2._8_8_) * 8))
                 && ((*(ulong *)(*(long *)local_4b0.field_2._8_8_ + (ulong)(uVar3 >> 6) * 8) >>
                      ((ulong)local_4b0._M_dataplus._M_p & 0x3f) & 1) != 0)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,"[Crate]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3);
                iVar20 = 0x119b;
LAB_001bca49:
                poVar14 = (ostream *)::std::ostream::operator<<((ostream *)local_440,iVar20);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                local_470[0] = local_460;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_470,
                           "Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data."
                           ,"");
                fmt::format<unsigned_long,unsigned_long>
                          (&local_4d0,(fmt *)local_470,&local_4b0,&local_4b0._M_string_length,in_R8)
                ;
                poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_440,local_4d0._M_dataplus._M_p,
                                     local_4d0._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                  operator_delete(local_4d0._M_dataplus._M_p,
                                  local_4d0.field_2._M_allocated_capacity + 1);
                }
                if (local_470[0] != local_460) {
                  operator_delete(local_470[0],local_460[0] + 1);
                }
                goto LAB_001bc1da;
              }
              Path::operator=(pPVar9 + (long)local_4b0._M_dataplus._M_p,&local_228);
LAB_001bbb62:
              _Var13._M_p = local_4b0._M_dataplus._M_p + 0x3f;
              if (-1 < (long)local_4b0._M_dataplus._M_p) {
                _Var13._M_p = local_4b0._M_dataplus._M_p;
              }
              puVar2 = (ulong *)(((long)_Var13._M_p >> 6) * 8 + *(long *)local_4b0.field_2._8_8_ +
                                 -8 + (ulong)(((ulong)local_4b0._M_dataplus._M_p &
                                              0x800000000000003f) < 0x8000000000000001) * 8);
              *puVar2 = *puVar2 | 1L << ((byte)local_4b0._M_dataplus._M_p & 0x3f);
              piVar11 = (((vector<int,_std::allocator<int>_> *)uVar24)->
                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              puVar16 = (unsigned_long *)
                        ((long)(((vector<int,_std::allocator<int>_> *)uVar24)->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar11 >> 2);
              if (puVar16 <= local_4b0._M_string_length) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3);
                iVar20 = 0x11d8;
LAB_001bc3b5:
                poVar14 = (ostream *)::std::ostream::operator<<(local_440,iVar20);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                pcVar23 = "Index is out-of-range";
LAB_001bc476:
                lVar18 = 0x15;
                goto LAB_001bc1be;
              }
              iVar20 = piVar11[local_4b0._M_string_length];
              if ((long)iVar20 < 1) {
                if (iVar20 == -1) goto LAB_001bbc1b;
              }
              else {
                puVar1 = (unsigned_long *)(local_4b0._M_string_length + (long)iVar20);
                puVar21 = puVar1;
                if (puVar16 <= puVar1) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3)
                  ;
                  poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_440,0x11e6)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                  pcVar23 = "jump index corrupted.";
                  goto LAB_001bc476;
                }
                while (local_470[0] = puVar1, -2 < piVar11[(long)puVar21]) {
                  puVar21 = (unsigned_long *)((long)puVar21 + 1);
                  local_4b0._M_dataplus._M_p = (pointer)puVar16;
                  if (puVar16 <= puVar21) goto LAB_001bc11d;
                }
                local_4b0._M_dataplus._M_p = (pointer)puVar21;
                if (puVar16 <= puVar21) {
LAB_001bc11d:
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3)
                  ;
                  poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_440,0x11fb)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                  pcVar23 = "jump indices seems corrupted.";
                  lVar18 = 0x1d;
                  goto LAB_001bc1be;
                }
                uVar24 = local_4b0.field_2._M_allocated_capacity;
                if (puVar1 <= puVar21) {
                  if (iVar20 != 1) {
                    local_440._0_8_ = local_4b0._M_string_length + 1;
                    if (local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_2c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                      ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_push_back_aux<unsigned_long>
                                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2c8,
                                 (unsigned_long *)local_440);
                    }
                    else {
                      *local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_440._0_8_;
                      local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                           local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                    }
                    local_440._0_8_ = (long)puVar1 - 1;
                    if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_278._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                      ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_push_back_aux<unsigned_long>
                                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_278,
                                 (unsigned_long *)local_440);
                    }
                    else {
                      *local_278._M_impl.super__Deque_impl_data._M_finish._M_cur = local_440._0_8_;
                      local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
                           local_278._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                    }
                    uVar25 = (ulong)(pvVar5->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [local_4b0._M_string_length];
                    pPVar9 = (this->_paths).
                             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    uVar17 = ((long)(this->_paths).
                                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar9 >> 4)
                             * 0x4ec4ec4ec4ec4ec5;
                    if (uVar17 < uVar25 || uVar17 - uVar25 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_440,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_440,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_440,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_440,"():",3);
                      iVar20 = 0x120d;
                      goto LAB_001bc3b5;
                    }
                    ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                              ((deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_158,
                               pPVar9 + uVar25);
                  }
                  if (local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_2c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    ::std::deque<unsigned_long,std::allocator<unsigned_long>>::
                    _M_push_back_aux<unsigned_long_const&>
                              ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_2c8,
                               (unsigned_long *)local_470);
                  }
                  else {
                    *local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         (unsigned_long)local_470[0];
                    local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                  }
                  uVar25 = local_490;
                  uVar24 = local_4b0.field_2._M_allocated_capacity;
                  if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_278._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    ::std::deque<unsigned_long,std::allocator<unsigned_long>>::
                    _M_push_back_aux<unsigned_long_const&>
                              ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_278,
                               (unsigned_long *)&local_4b0);
                  }
                  else {
                    *local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         (unsigned_long)local_4b0._M_dataplus._M_p;
                    local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         local_278._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                  }
                  ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                            ((deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_158,
                             &local_228);
                  uVar25 = uVar25 + 1;
                  break;
                }
LAB_001bbc1b:
                uVar25 = (ulong)(pvVar5->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start[local_4b0._M_string_length]
                ;
                pPVar9 = (this->_paths).
                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
                         .super__Vector_impl_data._M_start;
                uVar17 = ((long)(this->_paths).
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pPVar9 >> 4) *
                         0x4ec4ec4ec4ec4ec5;
                if (uVar17 < uVar25 || uVar17 - uVar25 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3)
                  ;
                  iVar20 = 0x1225;
                  goto LAB_001bc8b8;
                }
                Path::operator=(&local_228,pPVar9 + uVar25);
              }
              puVar16 = (unsigned_long *)(local_4b0._M_string_length + 1);
              uVar25 = local_490;
              local_4b0._M_string_length = (size_type)puVar16;
            } while (puVar16 < puVar15);
          }
          if (local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
          if (local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_2c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            puVar16 = (unsigned_long *)
                      local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
            operator_delete(local_2c8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_2c8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_2c8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_2c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_2c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            puVar16 = (unsigned_long *)local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1]
            ;
            local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_278._M_impl.super__Deque_impl_data._M_finish._M_first) {
            uVar17 = local_278._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
            operator_delete(local_278._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_278._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_278._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_278._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_278._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_278._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_278._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_278._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            uVar17 = local_278._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
            local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_278._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          pPVar22 = local_158._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_158._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_158._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pPVar22 = local_158._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 2;
          }
          Path::operator=(&local_228,pPVar22 + -1);
          ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::pop_back
                    ((deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_158);
          uVar25 = uVar25 + 1;
        } while (uVar25 < local_478);
      }
      bVar19 = true;
      if (local_478 <= uVar25) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_440,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_440,"BuildDecompressedPathsImpl",0x1a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"():",3);
        poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_440,0x1241);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
        pcVar23 = "PathIndex tree Too deep.";
        lVar18 = 0x18;
LAB_001bc1be:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,pcVar23,lVar18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_440,"\n",1);
LAB_001bc1da:
        ::std::__cxx11::stringbuf::str();
LAB_001bc201:
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_4d0._M_dataplus._M_p);
LAB_001bc209:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_440);
        ::std::ios_base::~ios_base((ios_base *)(local_440 + 0x70));
        bVar19 = false;
      }
      ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~deque
                ((deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_158);
      ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_278);
      ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._element._M_dataplus._M_p != &local_100._element.field_2) {
        operator_delete(local_100._element._M_dataplus._M_p,
                        local_100._element.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._variant_part_str._M_dataplus._M_p != &local_100._variant_part_str.field_2) {
        operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                        local_100._variant_part_str.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._variant_selection_part._M_dataplus._M_p !=
          &local_100._variant_selection_part.field_2) {
        operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                        local_100._variant_selection_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._variant_part._M_dataplus._M_p != &local_100._variant_part.field_2) {
        operator_delete(local_100._variant_part._M_dataplus._M_p,
                        local_100._variant_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
        operator_delete(local_100._prop_part._M_dataplus._M_p,
                        local_100._prop_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
        operator_delete(local_100._prim_part._M_dataplus._M_p,
                        local_100._prim_part.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._element._M_dataplus._M_p != &local_228._element.field_2) {
      operator_delete(local_228._element._M_dataplus._M_p,
                      local_228._element.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._variant_part_str._M_dataplus._M_p != &local_228._variant_part_str.field_2) {
      operator_delete(local_228._variant_part_str._M_dataplus._M_p,
                      local_228._variant_part_str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._variant_selection_part._M_dataplus._M_p !=
        &local_228._variant_selection_part.field_2) {
      operator_delete(local_228._variant_selection_part._M_dataplus._M_p,
                      local_228._variant_selection_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._variant_part._M_dataplus._M_p != &local_228._variant_part.field_2) {
      operator_delete(local_228._variant_part._M_dataplus._M_p,
                      local_228._variant_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._prop_part._M_dataplus._M_p != &local_228._prop_part.field_2) {
      operator_delete(local_228._prop_part._M_dataplus._M_p,
                      local_228._prop_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._prim_part._M_dataplus._M_p != &local_228._prim_part.field_2) {
      operator_delete(local_228._prim_part._M_dataplus._M_p,
                      local_228._prim_part.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar19;
}

Assistant:

bool CrateReader::BuildDecompressedPathsImpl(
    BuildDecompressedPathsArg *arg) {

  if (!arg) {
    return false;
  }

  Path parentPath = arg->parentPath;
  if (!arg->pathIndexes) {
    return false;
  }
  if (!arg->elementTokenIndexes) {
    return false;
  }
  if (!arg->jumps) {
    return false;
  }
  if (!arg->visit_table) {
    return false;
  }
  auto &pathIndexes = *arg->pathIndexes;
  auto &elementTokenIndexes = *arg->elementTokenIndexes;
  auto &jumps = *arg->jumps;
  auto &visit_table = *arg->visit_table;

  auto rootPath = Path::make_root_path();

  const size_t maxIter = _config.maxPathIndicesDecodeIteration;

  std::stack<size_t> startIndexStack;
  std::stack<size_t> endIndexStack;
  std::stack<Path> parentPathStack;

  size_t nIter = 0;

  size_t startIndex = arg->startIndex;
  size_t endIndex = arg->endIndex;

  while (nIter < maxIter) {

    DCOUT("startIndex = " << startIndex << ", endIdx = " << endIndex);

    for (size_t thisIndex = startIndex; thisIndex < (endIndex + 1); thisIndex++) {
      //auto thisIndex = curIndex++;
      DCOUT("thisIndex = " << thisIndex << ", pathIndexes.size = " << pathIndexes.size());
      if (parentPath.is_empty()) {
        // root node.
        // Assume single root node in the scene.
        DCOUT("paths[" << pathIndexes[thisIndex]
                       << "] is parent. name = " << parentPath.full_path_name());
        parentPath = rootPath;

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR("Index exceeds pathIndexes.size()");
          return false;
        }

        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx < visit_table.size()) {
          if (visit_table[idx]) {
            PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data.", idx, thisIndex));
          }
        }

        _paths[idx] = parentPath;
        visit_table[idx] = true;
      } else {
        if (thisIndex >= elementTokenIndexes.size()) {
          PUSH_ERROR("Index exceeds elementTokenIndexes.size()");
          return false;
        }
        int32_t _tokenIndex = elementTokenIndexes[thisIndex];
        DCOUT("elementTokenIndex = " << _tokenIndex);
        bool isPrimPropertyPath = _tokenIndex < 0;
        // ~0 returns -2147483648, so cast to uint32
        uint32_t tokenIndex = uint32_t(isPrimPropertyPath ? -_tokenIndex : _tokenIndex);

        DCOUT("tokenIndex = " << tokenIndex << ", _tokens.size = " << _tokens.size());
        if (tokenIndex >= _tokens.size()) {
          PUSH_ERROR("Invalid tokenIndex in BuildDecompressedPathsImpl.");
          return false;
        }
        auto const &elemToken = _tokens[size_t(tokenIndex)];
        DCOUT("elemToken = " << elemToken);
        DCOUT("[" << pathIndexes[thisIndex] << "].append = " << elemToken);

        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx >= _elemPaths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx < visit_table.size()) {
          if (visit_table[idx]) {
            PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data.", idx, thisIndex));
          }
        }

        // Reconstruct full path
        _paths[idx] =
            isPrimPropertyPath ? parentPath.AppendProperty(elemToken.str())
                               : parentPath.AppendElement(elemToken.str()); // prim, variantSelection, etc.

        // also set leaf path for 'primChildren' check
        _elemPaths[idx] = Path(elemToken.str(), "");
        //_paths[pathIndexes[thisIndex]].SetLocalPart(elemToken.str());

        visit_table[idx] = true;
      }

      // If we have either a child or a sibling but not both, then just
      // continue to the neighbor.  If we have both then spawn a task for the
      // sibling and do the child ourself.  We think that our path trees tend
      // to be broader more often than deep.

      if (thisIndex >= jumps.size()) {
        PUSH_ERROR("Index is out-of-range");
        return false;
      }

      bool hasChild = (jumps[thisIndex] > 0) || (jumps[thisIndex] == -1);
      bool hasSibling = (jumps[thisIndex] >= 0);
      DCOUT("hasChild = " << hasChild << ", hasSibling = " << hasSibling);

      if (hasChild) {
        if (hasSibling) {
          // NOTE(syoyo): This recursive call can be parallelized
          auto siblingIndex = thisIndex + size_t(jumps[thisIndex]);

          if (siblingIndex >= jumps.size()) {
            PUSH_ERROR_AND_RETURN("jump index corrupted.");
          }

          // Find subtree end.
          size_t subtreeStartIdx = siblingIndex;
          size_t subtreeIdx = subtreeStartIdx;

          for (; subtreeIdx < jumps.size(); subtreeIdx++) {

            bool has_child = (jumps[subtreeIdx] > 0) || (jumps[subtreeIdx] == -1);
            bool has_sibling = (jumps[subtreeIdx] >= 0);

            if (has_child || has_sibling) {
              continue;
            }
            break;
          }

          size_t subtreeEndIdx = subtreeIdx;
          if (subtreeEndIdx >= jumps.size()) {
            // Guess corrupted.
            PUSH_ERROR_AND_RETURN("jump indices seems corrupted.");
          }

          DCOUT("subtree startIdx " << subtreeStartIdx << ", subtree endIndex " << subtreeEndIdx);

          if (subtreeEndIdx >= subtreeStartIdx) {

            // index range after traversing subtree
            if (jumps[thisIndex] > 1) {

                // Setup stacks to resume loop from [Cont.]
                startIndexStack.push(thisIndex+1);
                // jumps should be always positive, so no siblingIndex < thisIndex
                endIndexStack.push(siblingIndex-1); // endIndex is inclusive so subtract 1.

                {
                  size_t idx = pathIndexes[thisIndex];
                  if (idx >= _paths.size()) {
                    PUSH_ERROR("Index is out-of-range");
                    return false;
                  }

                  parentPathStack.push(_paths[idx]);
                }
            }

            startIndexStack.push(subtreeStartIdx);
            endIndexStack.push(subtreeEndIdx);

            parentPathStack.push(parentPath);
            DCOUT("stack size: " << startIndexStack.size());

            nIter++;

            break; // goto `(A)`
          }

        }

        // [Cont.]
        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        parentPath = _paths[idx];

      }
    }

    // (A)

    if (startIndexStack.empty()) {
      break; // end traversal
    }

    startIndex = startIndexStack.top();
    startIndexStack.pop();

    endIndex = endIndexStack.top();
    endIndexStack.pop();

    parentPath = parentPathStack.top();
    parentPathStack.pop();

    nIter++;
  }

  if (nIter >= maxIter) {
    PUSH_ERROR_AND_RETURN("PathIndex tree Too deep.");
  }

  return true;
}